

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

LoadedFile * lf_load_keyfile(Filename *filename,char **errptr)

{
  _Bool _Var1;
  LoadFileStatus status;
  LoadedFile *lf;
  char **errptr_local;
  Filename *filename_local;
  
  filename_local = (Filename *)lf_new(0x56555);
  status = lf_load((LoadedFile *)filename_local,filename);
  _Var1 = lf_load_keyfile_helper(status,errptr);
  if (!_Var1) {
    lf_free((LoadedFile *)filename_local);
    filename_local = (Filename *)0x0;
  }
  return (LoadedFile *)filename_local;
}

Assistant:

LoadedFile *lf_load_keyfile(const Filename *filename, const char **errptr)
{
    LoadedFile *lf = lf_new(MAX_KEY_FILE_SIZE);
    if (!lf_load_keyfile_helper(lf_load(lf, filename), errptr)) {
        lf_free(lf);
        return NULL;
    }
    return lf;
}